

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pop3.c
# Opt level: O0

CURLcode pop3_multi_statemach(Curl_easy *data,_Bool *done)

{
  CURLcode CVar1;
  _Bool local_39;
  pingpong *ppStack_38;
  _Bool ssldone;
  pop3_conn *pop3c;
  connectdata *conn;
  _Bool *p_Stack_20;
  CURLcode result;
  _Bool *done_local;
  Curl_easy *data_local;
  
  conn._4_4_ = 0;
  pop3c = (pop3_conn *)data->conn;
  ppStack_38 = (pingpong *)&((connectdata *)pop3c)->proto;
  p_Stack_20 = done;
  done_local = (_Bool *)data;
  if (((((connectdata *)pop3c)->handler->flags & 1) != 0) &&
     ((*(byte *)((long)&((connectdata *)pop3c)->proto + 0xe2) & 1) == 0)) {
    local_39 = false;
    CVar1 = Curl_conn_connect(data,0,false,&local_39);
    *(byte *)((long)&ppStack_38[1].sendbuf.bufr + 2) =
         *(byte *)((long)&ppStack_38[1].sendbuf.bufr + 2) & 0xfe | local_39 & 1U;
    if (CVar1 != CURLE_OK) {
      return CVar1;
    }
    if (((ulong)ppStack_38[1].sendbuf.bufr & 0x10000) == 0) {
      return CURLE_OK;
    }
  }
  conn._4_4_ = 0;
  CVar1 = Curl_pp_statemach((Curl_easy *)done_local,ppStack_38,false,false);
  *p_Stack_20 = (int)ppStack_38[1].nread_resp == 0;
  return CVar1;
}

Assistant:

static CURLcode pop3_multi_statemach(struct Curl_easy *data, bool *done)
{
  CURLcode result = CURLE_OK;
  struct connectdata *conn = data->conn;
  struct pop3_conn *pop3c = &conn->proto.pop3c;

  if((conn->handler->flags & PROTOPT_SSL) && !pop3c->ssldone) {
    bool ssldone = FALSE;
    result = Curl_conn_connect(data, FIRSTSOCKET, FALSE, &ssldone);
    pop3c->ssldone = ssldone;
    if(result || !pop3c->ssldone)
      return result;
  }

  result = Curl_pp_statemach(data, &pop3c->pp, FALSE, FALSE);
  *done = (pop3c->state == POP3_STOP) ? TRUE : FALSE;

  return result;
}